

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testAttrOpaque(string *tempdir)

{
  int iVar1;
  exr_result_t eVar2;
  exr_context_t ctxt;
  ostream *poVar3;
  char *pcVar4;
  char *in_RCX;
  char *pcVar5;
  uint8_t *puVar6;
  _internal_exr_context *pctxt;
  uint8_t data4 [4];
  exr_attr_opaquedata_t local_98;
  exr_context_t f;
  exr_attr_opaquedata_t local_50;
  
  ctxt = createDummyFile("<opaque>");
  data4[0] = 0xde;
  data4[1] = 0xad;
  data4[2] = 0xbe;
  data4[3] = 0xef;
  f = ctxt;
  if (ctxt == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(ctxt + 0x40))
                      (ctxt,3,"Invalid reference to opaque data object to initialize");
    if (iVar1 == 3) {
      pcVar5 = (char *)0x80000000;
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Invalid size for opaque data (%lu bytes, must be <= INT32_MAX)");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_init (f, &o, (size_t) (2147483647) + 1)",(char *)0x35c,
                       0x15342b,pcVar5);
      }
      s_malloc_fail_on = 1;
      iVar1 = exr_attr_opaquedata_init(ctxt,&local_98,4);
      s_malloc_fail_on = 0;
      if (iVar1 != 1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_init (f, &o, 4)",(char *)0x35e,0x15342b,pcVar5);
      }
      pcVar5 = (char *)0xffffffff;
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Invalid size for opaque data (%lu bytes, must be <= INT32_MAX)");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_init (f, &o, (uint32_t) -1)",(char *)0x366,0x15342b,
                       pcVar5);
      }
      pcVar5 = (char *)0xffffffffffffffff;
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Invalid size for opaque data (%lu bytes, must be <= INT32_MAX)");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_init (f, &o, (size_t) -1)",(char *)0x369,0x15342b,pcVar5
                      );
      }
      iVar1 = exr_attr_opaquedata_init(ctxt,&local_98,4);
      if (iVar1 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_init (f, &o, 4)",(char *)0x36b,0x15342b,pcVar5);
      }
      if (local_98.size != 4) {
        core_test_fail("o.size == 4",(char *)0x36c,0x15342b,pcVar5);
      }
      if (local_98.packed_alloc_size != 4) {
        core_test_fail("o.packed_alloc_size == 4",(char *)0x36d,0x15342b,pcVar5);
      }
      if ((uint8_t (*) [4])local_98.packed_data == (uint8_t (*) [4])0x0) {
        core_test_fail("o.packed_data != __null",(char *)0x36e,0x15342b,pcVar5);
      }
      exr_attr_opaquedata_destroy(ctxt,&local_98);
      if (local_98.size != 0) {
        core_test_fail("o.size == 0",(char *)0x370,0x15342b,pcVar5);
      }
      if (local_98.packed_alloc_size != 0) {
        core_test_fail("o.packed_alloc_size == 0",(char *)0x371,0x15342b,pcVar5);
      }
      if ((uint8_t (*) [4])local_98.packed_data != (uint8_t (*) [4])0x0) {
        core_test_fail("o.packed_data == __null",(char *)0x372,0x15342b,pcVar5);
      }
      puVar6 = data4;
      eVar2 = exr_attr_opaquedata_create(ctxt,&local_98,4,puVar6);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_create (f, &o, 4, data4)",(char *)0x374,0x15342b,
                       (char *)puVar6);
      }
      if (local_98.size != 4) {
        core_test_fail("o.size == 4",(char *)0x375,0x15342b,(char *)puVar6);
      }
      if (local_98.packed_alloc_size != 4) {
        core_test_fail("o.packed_alloc_size == 4",(char *)0x376,0x15342b,(char *)puVar6);
      }
      if ((uint8_t (*) [4])local_98.packed_data == (uint8_t (*) [4])0x0) {
        core_test_fail("o.packed_data != __null",(char *)0x377,0x15342b,(char *)puVar6);
      }
      if (*local_98.packed_data != data4) {
        core_test_fail("0 == memcmp (o.packed_data, data4, 4)",(char *)0x378,0x15342b,(char *)puVar6
                      );
      }
      eVar2 = exr_attr_opaquedata_copy((exr_context_t)0x0,&local_50,&local_98);
      if (eVar2 != 2) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_copy (__null, &o2, &o)",(char *)0x37c,0x15342b,
                       (char *)puVar6);
      }
      eVar2 = exr_attr_opaquedata_copy(ctxt,(exr_attr_opaquedata_t *)0x0,&local_98);
      if (eVar2 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_copy (f, __null, &o)",(char *)0x380,0x15342b,
                       (char *)puVar6);
      }
      eVar2 = exr_attr_opaquedata_copy(ctxt,&local_50,&local_98);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_copy (f, &o2, &o)",(char *)0x381,0x15342b,(char *)puVar6
                      );
      }
      if (local_50.size != 4) {
        core_test_fail("o2.size == 4",(char *)0x382,0x15342b,(char *)puVar6);
      }
      if (local_50.packed_alloc_size != 4) {
        core_test_fail("o2.packed_alloc_size == 4",(char *)0x383,0x15342b,(char *)puVar6);
      }
      if ((uint8_t (*) [4])local_50.packed_data == (uint8_t (*) [4])0x0) {
        core_test_fail("o2.packed_data != __null",(char *)0x384,0x15342b,(char *)puVar6);
      }
      if (*local_50.packed_data != data4) {
        core_test_fail("0 == memcmp (o2.packed_data, data4, 4)",(char *)0x385,0x15342b,
                       (char *)puVar6);
      }
      eVar2 = exr_attr_opaquedata_destroy(ctxt,&local_50);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_destroy (f, &o2)",(char *)0x386,0x15342b,(char *)puVar6)
        ;
      }
      eVar2 = exr_attr_opaquedata_destroy(ctxt,&local_98);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_destroy (f, &o)",(char *)0x388,0x15342b,(char *)puVar6);
      }
      eVar2 = exr_attr_opaquedata_destroy(ctxt,&local_98);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_destroy (f, &o)",(char *)0x38a,0x15342b,(char *)puVar6);
      }
      local_98.unpack_func_ptr =
           (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
      local_98.pack_func_ptr =
           (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
      local_98.packed_data = (void *)0x0;
      local_98.unpacked_data = (void *)0x0;
      local_98.size = 0;
      local_98.unpacked_size = 0;
      local_98.packed_alloc_size = 0;
      local_98.pad[0] = '\0';
      local_98.pad[1] = '\0';
      local_98.pad[2] = '\0';
      local_98.pad[3] = '\0';
      local_98.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
      iVar1 = (**(code **)(ctxt + 0x38))(ctxt,3);
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar5);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_set_unpacked (f, __null, data4, 4)",(char *)0x392,
                       0x15342b,(char *)puVar6);
      }
      pcVar5 = (char *)0xffffffffffffffff;
      iVar1 = (**(code **)(ctxt + 0x48))(ctxt,3,"Opaque data given invalid negative size (%d)");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_set_unpacked (f, &o, data4, -1)",(char *)0x395,0x15342b,
                       pcVar5);
      }
      pcVar5 = (char *)0x4;
      eVar2 = exr_attr_opaquedata_set_unpacked(ctxt,&local_98,data4,4);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_set_unpacked (f, &o, data4, 4)",(char *)0x396,0x15342b,
                       pcVar5);
      }
      eVar2 = exr_attr_opaquedata_destroy(ctxt,&local_98);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_destroy (f, &o)",(char *)0x397,0x15342b,pcVar5);
      }
      local_98.unpack_func_ptr =
           (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
      local_98.pack_func_ptr =
           (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
      local_98.packed_data = (void *)0x0;
      local_98.unpacked_data = (void *)0x0;
      local_98.size = 0;
      local_98.unpacked_size = 0;
      local_98.packed_alloc_size = 0;
      local_98.pad[0] = '\0';
      local_98.pad[1] = '\0';
      local_98.pad[2] = '\0';
      local_98.pad[3] = '\0';
      local_98.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
      pcVar5 = (char *)0x4;
      eVar2 = exr_attr_opaquedata_set_unpacked(ctxt,&local_98,data4,4);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_set_unpacked (f, &o, data4, 4)",(char *)0x399,0x15342b,
                       pcVar5);
      }
      pcVar5 = (char *)0x0;
      eVar2 = exr_attr_opaquedata_set_unpacked(ctxt,&local_98,(void *)0x0,0);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_set_unpacked (f, &o, __null, 0)",(char *)0x39a,0x15342b,
                       pcVar5);
      }
      puVar6 = data4;
      eVar2 = exr_attr_opaquedata_create(ctxt,&local_98,4,puVar6);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_create (f, &o, 4, data4)",(char *)0x39b,0x15342b,
                       (char *)puVar6);
      }
      pcVar5 = (char *)0x4;
      eVar2 = exr_attr_opaquedata_set_unpacked(ctxt,&local_98,data4,4);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_set_unpacked (f, &o, data4, 4)",(char *)0x39c,0x15342b,
                       pcVar5);
      }
      eVar2 = exr_attr_opaquedata_copy(ctxt,&local_50,&local_98);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_copy (f, &o2, &o)",(char *)0x39d,0x15342b,pcVar5);
      }
      eVar2 = exr_attr_opaquedata_destroy(ctxt,&local_50);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_destroy (f, &o2)",(char *)0x39e,0x15342b,pcVar5);
      }
      eVar2 = exr_attr_opaquedata_destroy(ctxt,&local_98);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_opaquedata_destroy (f, &o)",(char *)0x39f,0x15342b,pcVar5);
      }
      exr_finish(&f);
      return;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar5 = (char *)exr_get_default_error_message(iVar1);
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3,"\n    expected: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar5 = (char *)exr_get_default_error_message(3);
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  core_test_fail("exr_attr_opaquedata_init (f, __null, 4)",(char *)0x359,0x15342b,in_RCX);
}

Assistant:

void
testAttrOpaque (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testOpaqueHelper (NULL);
    exr_context_t f = createDummyFile ("<opaque>");
    testOpaqueHelper (f);
    exr_finish (&f);
}